

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void icu_63::ICU_Utility::appendToRule
               (UnicodeString *rule,UnicodeString *text,UBool isLiteral,UBool escapeUnprintable,
               UnicodeString *quoteBuf)

{
  char16_t cVar1;
  int32_t iVar2;
  undefined4 local_2c;
  int32_t i;
  UnicodeString *quoteBuf_local;
  UBool escapeUnprintable_local;
  UBool isLiteral_local;
  UnicodeString *text_local;
  UnicodeString *rule_local;
  
  local_2c = 0;
  while( true ) {
    iVar2 = UnicodeString::length(text);
    if (iVar2 <= local_2c) break;
    cVar1 = UnicodeString::operator[](text,local_2c);
    appendToRule(rule,(uint)(ushort)cVar1,isLiteral,escapeUnprintable,quoteBuf);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void ICU_Utility::appendToRule(UnicodeString& rule,
                               const UnicodeString& text,
                               UBool isLiteral,
                               UBool escapeUnprintable,
                               UnicodeString& quoteBuf) {
    for (int32_t i=0; i<text.length(); ++i) {
        appendToRule(rule, text[i], isLiteral, escapeUnprintable, quoteBuf);
    }
}